

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CreateFunc(sqlite3 *db,char *zFunctionName,int nArg,int enc,void *pUserData,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,_func_void_sqlite3_context_ptr *xValue,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xInverse,
                     FuncDestructor *pDestructor)

{
  int iVar1;
  size_t sVar2;
  FuncDef *pFVar3;
  Vdbe *pVVar4;
  uint uVar5;
  uint uVar6;
  
  if (((zFunctionName != (char *)0x0) &&
      (xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
       xFinal == (_func_void_sqlite3_context_ptr *)0x0)) &&
     ((xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) !=
      (xFinal == (_func_void_sqlite3_context_ptr *)0x0))) {
    if (((0xffffff7e < nArg - 0x80U) &&
        ((xValue == (_func_void_sqlite3_context_ptr *)0x0) ==
         (xInverse == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0))) &&
       (sVar2 = strlen(zFunctionName), (sVar2 & 0x3fffff00) == 0)) {
      uVar6 = enc & 0x380800;
      uVar5 = enc & 7;
      if (2 < uVar5 - 1) {
        if (uVar5 == 5) {
          iVar1 = sqlite3CreateFunc(db,zFunctionName,nArg,uVar6 | 1,pUserData,xSFunc,xStep,xFinal,
                                    xValue,xInverse,pDestructor);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = sqlite3CreateFunc(db,zFunctionName,nArg,uVar6 | 2,pUserData,xSFunc,xStep,xFinal,
                                    xValue,xInverse,pDestructor);
          if (iVar1 != 0) {
            return iVar1;
          }
          uVar5 = 3;
        }
        else if (uVar5 == 4) {
          uVar5 = 2;
        }
        else {
          uVar5 = 1;
        }
      }
      pFVar3 = sqlite3FindFunction(db,zFunctionName,nArg,(u8)uVar5,'\0');
      if (((pFVar3 == (FuncDef *)0x0) || ((pFVar3->funcFlags & 3) != uVar5)) ||
         (pFVar3->nArg != nArg)) {
        if (xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
            xFinal == (_func_void_sqlite3_context_ptr *)0x0) {
          return 0;
        }
      }
      else {
        if (db->nVdbeActive != 0) {
          sqlite3ErrorWithMsg(db,5,"unable to delete/modify user-function due to active statements")
          ;
          return 5;
        }
        for (pVVar4 = db->pVdbe; pVVar4 != (Vdbe *)0x0; pVVar4 = pVVar4->pVNext) {
          pVVar4->field_0xc6 = (pVVar4->field_0xc6 & 0xfc) + 1;
        }
      }
      pFVar3 = sqlite3FindFunction(db,zFunctionName,nArg,(u8)uVar5,'\x01');
      if (pFVar3 != (FuncDef *)0x0) {
        functionDestroy(db,(pFVar3->u).pHash);
        if (pDestructor != (FuncDestructor *)0x0) {
          pDestructor->nRef = pDestructor->nRef + 1;
        }
        (pFVar3->u).pDestructor = pDestructor;
        if (xSFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
          xStep = xSFunc;
        }
        pFVar3->funcFlags = (pFVar3->funcFlags & 3 | uVar6) ^ 0x200000;
        pFVar3->xSFunc = xStep;
        pFVar3->xFinalize = xFinal;
        pFVar3->xValue = xValue;
        pFVar3->xInverse = xInverse;
        pFVar3->pUserData = pUserData;
        pFVar3->nArg = (i8)nArg;
        return 0;
      }
      return 7;
    }
  }
  sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2a8ab,
              "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  return 0x15;
}

Assistant:

SQLITE_PRIVATE int sqlite3CreateFunc(
  sqlite3 *db,
  const char *zFunctionName,
  int nArg,
  int enc,
  void *pUserData,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value **),
  void (*xStep)(sqlite3_context*,int,sqlite3_value **),
  void (*xFinal)(sqlite3_context*),
  void (*xValue)(sqlite3_context*),
  void (*xInverse)(sqlite3_context*,int,sqlite3_value **),
  FuncDestructor *pDestructor
){
  FuncDef *p;
  int extraFlags;

  assert( sqlite3_mutex_held(db->mutex) );
  assert( xValue==0 || xSFunc==0 );
  if( zFunctionName==0                /* Must have a valid name */
   || (xSFunc!=0 && xFinal!=0)        /* Not both xSFunc and xFinal */
   || ((xFinal==0)!=(xStep==0))       /* Both or neither of xFinal and xStep */
   || ((xValue==0)!=(xInverse==0))    /* Both or neither of xValue, xInverse */
   || (nArg<-1 || nArg>SQLITE_MAX_FUNCTION_ARG)
   || (255<sqlite3Strlen30(zFunctionName))
  ){
    return SQLITE_MISUSE_BKPT;
  }

  assert( SQLITE_FUNC_CONSTANT==SQLITE_DETERMINISTIC );
  assert( SQLITE_FUNC_DIRECT==SQLITE_DIRECTONLY );
  extraFlags = enc &  (SQLITE_DETERMINISTIC|SQLITE_DIRECTONLY|
                       SQLITE_SUBTYPE|SQLITE_INNOCUOUS);
  enc &= (SQLITE_FUNC_ENCMASK|SQLITE_ANY);

  /* The SQLITE_INNOCUOUS flag is the same bit as SQLITE_FUNC_UNSAFE.  But
  ** the meaning is inverted.  So flip the bit. */
  assert( SQLITE_FUNC_UNSAFE==SQLITE_INNOCUOUS );
  extraFlags ^= SQLITE_FUNC_UNSAFE;


#ifndef SQLITE_OMIT_UTF16
  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  **
  ** If SQLITE_ANY is specified, add three versions of the function
  ** to the hash table.
  */
  switch( enc ){
    case SQLITE_UTF16:
      enc = SQLITE_UTF16NATIVE;
      break;
    case SQLITE_ANY: {
      int rc;
      rc = sqlite3CreateFunc(db, zFunctionName, nArg,
           (SQLITE_UTF8|extraFlags)^SQLITE_FUNC_UNSAFE,
           pUserData, xSFunc, xStep, xFinal, xValue, xInverse, pDestructor);
      if( rc==SQLITE_OK ){
        rc = sqlite3CreateFunc(db, zFunctionName, nArg,
             (SQLITE_UTF16LE|extraFlags)^SQLITE_FUNC_UNSAFE,
             pUserData, xSFunc, xStep, xFinal, xValue, xInverse, pDestructor);
      }
      if( rc!=SQLITE_OK ){
        return rc;
      }
      enc = SQLITE_UTF16BE;
      break;
    }
    case SQLITE_UTF8:
    case SQLITE_UTF16LE:
    case SQLITE_UTF16BE:
      break;
    default:
      enc = SQLITE_UTF8;
      break;
  }
#else
  enc = SQLITE_UTF8;
#endif

  /* Check if an existing function is being overridden or deleted. If so,
  ** and there are active VMs, then return SQLITE_BUSY. If a function
  ** is being overridden/deleted but there are no active VMs, allow the
  ** operation to continue but invalidate all precompiled statements.
  */
  p = sqlite3FindFunction(db, zFunctionName, nArg, (u8)enc, 0);
  if( p && (p->funcFlags & SQLITE_FUNC_ENCMASK)==(u32)enc && p->nArg==nArg ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY,
        "unable to delete/modify user-function due to active statements");
      assert( !db->mallocFailed );
      return SQLITE_BUSY;
    }else{
      sqlite3ExpirePreparedStatements(db, 0);
    }
  }else if( xSFunc==0 && xFinal==0 ){
    /* Trying to delete a function that does not exist.  This is a no-op.
    ** https://sqlite.org/forum/forumpost/726219164b */
    return SQLITE_OK;
  }

  p = sqlite3FindFunction(db, zFunctionName, nArg, (u8)enc, 1);
  assert(p || db->mallocFailed);
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }

  /* If an older version of the function with a configured destructor is
  ** being replaced invoke the destructor function here. */
  functionDestroy(db, p);

  if( pDestructor ){
    pDestructor->nRef++;
  }
  p->u.pDestructor = pDestructor;
  p->funcFlags = (p->funcFlags & SQLITE_FUNC_ENCMASK) | extraFlags;
  testcase( p->funcFlags & SQLITE_DETERMINISTIC );
  testcase( p->funcFlags & SQLITE_DIRECTONLY );
  p->xSFunc = xSFunc ? xSFunc : xStep;
  p->xFinalize = xFinal;
  p->xValue = xValue;
  p->xInverse = xInverse;
  p->pUserData = pUserData;
  p->nArg = (u16)nArg;
  return SQLITE_OK;
}